

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_alloc_get(Integer datatype,Integer nelem,char *name,Integer *memhandle,
                    MA_AccessIndex *index)

{
  Boolean BVar1;
  
  ma_stats.calls[0] = ma_stats.calls[0] + 1;
  BVar1 = MA_allocate_heap(datatype,nelem,name,memhandle);
  if (BVar1 != 0) {
    BVar1 = MA_get_index(*memhandle,index);
    return BVar1;
  }
  return 0;
}

Assistant:

public Boolean MA_alloc_get(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle,    /* RETURN: handle for this block */
    MA_AccessIndex    *index  /* RETURN: index for this block */   )
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_alloc_get]++;
#endif /* STATS */

    if (MA_allocate_heap(datatype, nelem, name, memhandle))
        /* MA_allocate_heap succeeded; try MA_get_index */
        return MA_get_index(*memhandle, index);
    else
        /* MA_allocate_heap failed */
        return MA_FALSE;
}